

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ED.cpp
# Opt level: O3

ED * __thiscall ED::drawParticularSegments(ED *this,vector<int,_std::allocator<int>_> *list)

{
  undefined8 uVar1;
  int *piVar2;
  pointer piVar3;
  undefined8 *in_RDX;
  int *piVar4;
  int *piVar5;
  undefined8 local_40;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  uVar1 = *(undefined8 *)
           list[0x10].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  local_40 = CONCAT44((int)uVar1,(int)((ulong)uVar1 >> 0x20));
  local_28 = (undefined1  [16])0x0;
  local_38 = (undefined1  [16])0x0;
  cv::Mat::Mat((Mat *)this,&local_40,
               *(uint *)&list[0xd].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish & 0xfff);
  piVar2 = (int *)*in_RDX;
  piVar4 = (int *)in_RDX[1];
  if (piVar2 != piVar4) {
    piVar3 = (list->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
    do {
      piVar5 = *(int **)(piVar3 + (long)*piVar2 * 6);
      if (piVar5 != *(int **)(piVar3 + (long)*piVar2 * 6 + 2)) {
        do {
          *(undefined1 *)
           ((long)&(((this->segmentPoints).
                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
                   super__Vector_impl_data +
           (long)*piVar5 + (long)piVar5[1] * **(long **)&this->field_0x48) = 0xff;
          piVar5 = piVar5 + 2;
          piVar3 = (list->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        } while (piVar5 != *(int **)(piVar3 + (long)*piVar2 * 6 + 2));
        piVar4 = (int *)in_RDX[1];
      }
      piVar2 = piVar2 + 1;
    } while (piVar2 != piVar4);
  }
  return this;
}

Assistant:

Mat ED::drawParticularSegments(std::vector<int> list)
{
	Mat segmentsImage = Mat(edgeImage.size(), edgeImage.type(), Scalar(0));

	std::vector<Point>::iterator it;
	std::vector<int>::iterator itInt;

	for (itInt = list.begin(); itInt != list.end(); itInt++)
		for (it = segmentPoints[*itInt].begin(); it != segmentPoints[*itInt].end(); it++)
			segmentsImage.at<uchar>(*it) = 255;
	
	return segmentsImage;
}